

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall
discordpp::MessageComponentData::MessageComponentData
          (MessageComponentData *this,MessageComponentData *param_1)

{
  MessageComponentData *param_1_local;
  MessageComponentData *this_local;
  
  ResolvedData::ResolvedData(&this->super_ResolvedData,&param_1->super_ResolvedData);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->custom_id,&param_1->custom_id);
  field<int>::field(&this->component_type,&param_1->component_type);
  omittable_field<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>_>::
  omittable_field(&this->values,&param_1->values);
  return;
}

Assistant:

MessageComponentData(
        omittable_field<std::map<Snowflake, User> > users = omitted,
        omittable_field<std::map<Snowflake, GuildMember> > members = omitted,
        omittable_field<std::map<Snowflake, Role> > roles = omitted,
        omittable_field<std::map<Snowflake, Channel> > channels = omitted,
        omittable_field<std::map<Snowflake, Message> > messages = omitted,
        omittable_field<std::map<Snowflake, Attachment> > attachments = omitted,
        field<std::string> custom_id = uninitialized,
        field<int> component_type = uninitialized,
        omittable_field<std::vector<SelectOption> > values = omitted
    ):
        ResolvedData(
            users,
            members,
            roles,
            channels,
            messages,
            attachments
        ),
        custom_id(custom_id),
        component_type(component_type),
        values(values)
    {}